

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::OverheadTest_DefaultMaxBlockSize_Test::TestBody
          (OverheadTest_DefaultMaxBlockSize_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_a8;
  Message local_a0;
  int local_94;
  uintptr_t local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  int local_64;
  undefined1 local_60 [4];
  int i;
  OverheadTest test;
  OverheadTest_DefaultMaxBlockSize_Test *this_local;
  
  test.arena_alloc_count_ = (uintptr_t)this;
  OverheadTest::OverheadTest((OverheadTest *)local_60,0,0);
  for (local_64 = 0; local_64 < 600; local_64 = local_64 + 1) {
    OverheadTest::Alloc((OverheadTest *)local_60,0x400);
  }
  local_90 = OverheadTest::SpaceAllocated((OverheadTest *)local_60);
  local_94 = 0xaf000;
  testing::internal::CmpHelperLE<unsigned_long,int>
            ((internal *)local_88,"test.SpaceAllocated()","700 * 1024",&local_90,&local_94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/arena_test.cc"
               ,299,message);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  OverheadTest::~OverheadTest((OverheadTest *)local_60);
  return;
}

Assistant:

TEST(OverheadTest, DefaultMaxBlockSize) {
  OverheadTest test;
  // Perform 600 1k allocations (600k total) and ensure that the amount of
  // memory allocated does not exceed 700k.
  for (int i = 0; i < 600; ++i) {
    test.Alloc(1024);
  }
  EXPECT_LE(test.SpaceAllocated(), 700 * 1024);
}